

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O1

int output_intelhex(char *fname,int length)

{
  FILE *__stream;
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  __stream = fopen(fname,"w");
  if (__stream == (FILE *)0x0) {
    iVar3 = 0;
  }
  else {
    if (0 < length) {
      uVar4 = 0;
      do {
        uVar1 = length - uVar4;
        uVar5 = 0x20;
        if ((int)uVar1 < 0x20) {
          uVar5 = uVar1;
        }
        iVar3 = ((int)uVar4 >> 8) + uVar4 + uVar5;
        fprintf(__stream,":%2.2X%4.4X00",(ulong)uVar5,(ulong)uVar4);
        if (0 < (int)uVar1) {
          uVar6 = 1;
          if (1 < (int)uVar5) {
            uVar6 = (ulong)uVar5;
          }
          uVar2 = 0;
          do {
            fprintf(__stream,"%2.2X",(ulong)ebuf[(long)(int)uVar4 + uVar2]);
            iVar3 = iVar3 + (uint)ebuf[(long)(int)uVar4 + uVar2];
            uVar2 = uVar2 + 1;
          } while (uVar6 != uVar2);
        }
        fprintf(__stream,"%2.2X\n",(ulong)(-iVar3 & 0xff));
        uVar4 = uVar4 + uVar5;
      } while ((int)uVar4 < length);
    }
    fwrite(":00000001FF\n",0xc,1,__stream);
    fclose(__stream);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int output_intelhex(char *fname, int length)
{
   FILE *fp;
 
   int cc = 0, ll, sum, i;

   fp = fopen(fname, "w");
   if(fp == NULL) 
      return 0;
   while (cc < length)
   {
      ll = length - cc;
      if (ll > IHEXLENGTH) ll = IHEXLENGTH;
      sum = ll + (cc >> 8) + (cc & 0xff);
      fprintf(fp, ":%2.2X%4.4X00", ll, cc);
      for (i = 0; i < ll; i++)
      {
         fprintf(fp, "%2.2X", ebuf[cc + i]);
         sum += ebuf[cc + i];
      }
      fprintf(fp, "%2.2X\n", (0x100 - sum) & 0xff);
      cc += ll;
   }
   fprintf(fp, ":00000001FF\n");   
   fclose(fp);
   
   return 1;
}